

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 CalcWindowAutoFitSize(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  byte bVar3;
  char cVar4;
  ImGuiContext *g;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  ImVec2 IVar10;
  float extraout_XMM0_Db;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar17;
  float fVar18;
  undefined1 auVar15 [16];
  float fVar19;
  undefined1 auVar16 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  pIVar2 = GImGui;
  fVar8 = 0.0;
  if ((window->Flags & 1) == 0) {
    fVar8 = GImGui->FontBaseSize * window->FontWindowScale;
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      fVar8 = fVar8 * window->ParentWindow->FontWindowScale;
    }
    fVar23 = (GImGui->Style).FramePadding.y;
    fVar8 = fVar23 + fVar23 + fVar8;
  }
  fVar9 = ImGuiWindow::MenuBarHeight(window);
  fVar23 = (window->WindowPadding).x;
  fVar20 = (window->WindowPadding).y;
  fVar23 = fVar23 + fVar23;
  fVar20 = fVar20 + fVar20;
  fVar26 = size_contents->x + fVar23;
  fVar27 = fVar9 + fVar8 + size_contents->y + fVar20;
  fVar28 = extraout_XMM0_Db + 0.0;
  if (((uint)window->Flags >> 0x19 & 1) == 0) {
    auVar15._8_8_ = 0;
    auVar15._0_4_ = (pIVar2->Style).WindowMinSize.x;
    auVar15._4_4_ = (pIVar2->Style).WindowMinSize.y;
    IVar10 = (pIVar2->Style).DisplaySafeAreaPadding;
    if ((window->Flags & 0x14000000U) != 0) {
      auVar15 = minps(auVar15,_DAT_0017ef90);
    }
    IVar1 = ((*(GImGui->Viewports).Data)->super_ImGuiViewport).Size;
    fVar17 = IVar10.x;
    fVar14 = IVar10.y;
    fVar21 = IVar1.x - (fVar17 + fVar17);
    fVar22 = IVar1.y - (fVar14 + fVar14);
    fVar14 = auVar15._0_4_;
    fVar17 = auVar15._4_4_;
    fVar18 = auVar15._8_4_;
    fVar19 = auVar15._12_4_;
    uVar5 = -(uint)(fVar21 <= fVar14);
    uVar6 = -(uint)(fVar22 <= fVar17);
    fVar24 = (float)((uint)fVar18 & -(uint)(0.0 <= fVar18));
    fVar25 = (float)((uint)fVar19 & -(uint)(0.0 <= fVar19));
    fVar21 = (float)(~uVar5 & (uint)fVar21 | (uint)fVar14 & uVar5);
    fVar22 = (float)(~uVar6 & (uint)fVar22 | (uint)fVar17 & uVar6);
    uVar5 = -(uint)(fVar21 < fVar26);
    uVar6 = -(uint)(fVar22 < fVar27);
    uVar7 = -(uint)(fVar25 < fVar28);
    auVar16._0_4_ = (uint)fVar14 & -(uint)(fVar26 < fVar14);
    auVar16._4_4_ = (uint)fVar17 & -(uint)(fVar27 < fVar17);
    auVar16._8_4_ = (uint)fVar18 & -(uint)(0.0 < fVar18);
    auVar16._12_4_ = (uint)fVar19 & -(uint)(fVar28 < fVar19);
    auVar11._0_4_ =
         ~-(uint)(fVar26 < fVar14) & (~uVar5 & (uint)(fVar26 + 0.0) | (uint)fVar21 & uVar5);
    auVar11._4_4_ = ~-(uint)(fVar27 < fVar17) & (~uVar6 & (uint)fVar27 | (uint)fVar22 & uVar6);
    auVar11._8_4_ = ~-(uint)(0.0 < fVar18) & (uint)fVar24 & -(uint)(fVar24 < 0.0);
    auVar11._12_4_ = ~-(uint)(fVar28 < fVar19) & (~uVar7 & (uint)fVar28 | (uint)fVar25 & uVar7);
    auVar12 = auVar11 | auVar16;
    IVar10 = CalcWindowSizeAfterConstraint(window,auVar12._0_8_);
    uVar5 = window->Flags;
    bVar3 = 1;
    cVar4 = '\x01';
    if (size_contents->x <= IVar10.x - fVar23 || (uVar5 & 0x808) != 0x800) {
      cVar4 = (char)((uVar5 & 0xffff) >> 0xf);
    }
    if (size_contents->y <= (IVar10.y - fVar20) - (fVar9 + fVar8) || (uVar5 & 8) != 0) {
      bVar3 = (byte)(uVar5 >> 0xe) & 1;
    }
    if (cVar4 != '\0') {
      auVar12._4_4_ = auVar12._4_4_ + (pIVar2->Style).ScrollbarSize;
    }
    IVar10 = auVar12._0_8_;
    if (bVar3 != 0) {
      auVar13._4_12_ = auVar12._4_12_;
      auVar13._0_4_ = auVar12._0_4_ + (pIVar2->Style).ScrollbarSize;
      IVar10 = auVar13._0_8_;
    }
  }
  else {
    IVar10.x = fVar26 + 0.0 + 1.5;
    IVar10.y = fVar27 + 0.0;
  }
  return IVar10;
}

Assistant:

static ImVec2 CalcWindowAutoFitSize(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 size_decorations = ImVec2(0.0f, window->TitleBarHeight() + window->MenuBarHeight());
    ImVec2 size_pad = window->WindowPadding * 2.0f;
    ImVec2 size_desired = size_contents + size_pad + size_decorations;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_desired + ImVec2(1.5f, 0.0f);
    }
    else
    {
        // Maximum window size is determined by the viewport size or monitor size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));

        // FIXME-VIEWPORT-WORKAREA: May want to use GetWorkSize() instead of Size depending on the type of windows?
        ImVec2 avail_size = ImGui::GetMainViewport()->Size;
        ImVec2 size_auto_fit = ImClamp(size_desired, size_min, ImMax(size_min, avail_size - style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcWindowSizeAfterConstraint(window, size_auto_fit);
        bool will_have_scrollbar_x = (size_auto_fit_after_constraint.x - size_pad.x - size_decorations.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysHorizontalScrollbar);
        bool will_have_scrollbar_y = (size_auto_fit_after_constraint.y - size_pad.y - size_decorations.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysVerticalScrollbar);
        if (will_have_scrollbar_x)
            size_auto_fit.y += style.ScrollbarSize;
        if (will_have_scrollbar_y)
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}